

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rkd_tree_hh_data.hpp
# Opt level: O0

void pico_tree::internal::
     rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>::
     rotate_point<float_const*,float*>(rotation_type *rotation,float **x,float **y)

{
  size_type sVar1;
  scalar_type *psVar2;
  point<float,_784UL> *ppVar3;
  long *in_RDX;
  long *in_RSI;
  size_t i_1;
  size_t i;
  scalar_type dot;
  undefined4 in_stack_ffffffffffffffb8;
  float fVar4;
  undefined4 in_stack_ffffffffffffffbc;
  float fVar5;
  point<float,_784UL> *in_stack_ffffffffffffffc0;
  point<float,_784UL> *this;
  point<float,_784UL> *local_30;
  ulong local_28;
  float local_1c;
  
  local_1c = 0.0;
  local_28 = 0;
  while( true ) {
    sVar1 = point<float,_784UL>::size((point<float,_784UL> *)0x1102d9);
    if (sVar1 <= local_28) break;
    psVar2 = point<float,_784UL>::operator[]
                       (in_stack_ffffffffffffffc0,
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    local_1c = *psVar2 * *(float *)(*in_RSI + local_28 * 4) + local_1c;
    local_28 = local_28 + 1;
  }
  local_30 = (point<float,_784UL> *)0x0;
  while( true ) {
    this = local_30;
    ppVar3 = (point<float,_784UL> *)point<float,_784UL>::size((point<float,_784UL> *)0x110360);
    if (ppVar3 <= this) break;
    fVar5 = *(float *)(*in_RSI + (long)local_30 * 4);
    fVar4 = local_1c * 2.0;
    psVar2 = point<float,_784UL>::operator[](this,CONCAT44(fVar5,local_1c * 2.0));
    *(float *)(*in_RDX + (long)local_30 * 4) = -fVar4 * *psVar2 + fVar5;
    local_30 = (point<float,_784UL> *)((long)(local_30->elems_)._M_elems + 1);
  }
  return;
}

Assistant:

static void rotate_point(
      rotation_type const& rotation, ArrayTypeIn_ const& x, ArrayTypeOut_& y) {
    scalar_type dot = scalar_type(0);
    for (size_t i = 0; i < rotation.size(); ++i) {
      dot += rotation[i] * x[i];
    }
    dot *= scalar_type(2);
    for (size_t i = 0; i < rotation.size(); ++i) {
      y[i] = x[i] - (dot * rotation[i]);
    }
  }